

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_2ffa89::ArgParser::argJobJsonHelp(ArgParser *this)

{
  Pipeline *this_00;
  shared_ptr<Pipeline> sVar1;
  QPDFLogger local_48;
  bool local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string local_28;
  
  QPDFLogger::defaultLogger();
  sVar1 = QPDFLogger::getInfo(&local_48,local_38);
  QPDFJob::job_json_schema_abi_cxx11_
            (&local_28,(QPDFJob *)0x1,
             (int)sVar1.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  this_00 = Pipeline::operator<<
                      ((Pipeline *)
                       local_48.m.
                       super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &local_28);
  Pipeline::operator<<(this_00,"\n");
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void
ArgParser::argJobJsonHelp()
{
    *QPDFLogger::defaultLogger()->getInfo()
        << QPDFJob::job_json_schema(QPDFJob::LATEST_JOB_JSON) << "\n";
}